

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O3

void __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::setChild
          (SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *this,size_t index,
          TokenOrSyntax child)

{
  _Variadic_union<const_slang::syntax::SyntaxNode_*> *p_Var1;
  pointer pTVar2;
  
  if (index < (this->elements).size_) {
    pTVar2 = (this->elements).data_;
    *(__index_type *)
     ((long)&pTVar2[index].super_ConstTokenOrSyntax.
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = child.super_ConstTokenOrSyntax.
         super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         _M_index;
    p_Var1 = (_Variadic_union<const_slang::syntax::SyntaxNode_*> *)(pTVar2 + index);
    *p_Var1 = child.super_ConstTokenOrSyntax.
              super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
              ._M_u._M_rest;
    p_Var1[1] = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)
                child.super_ConstTokenOrSyntax.
                super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                ._M_u._M_first._M_storage.info;
    return;
  }
  std::terminate();
}

Assistant:

void setChild(size_t index, TokenOrSyntax child) final { elements[index] = child; }